

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::arrayExpr(Parser *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Lexer *pLVar3;
  long lVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  Report *pRVar5;
  undefined8 uVar8;
  pointer puVar9;
  bool bVar10;
  LiteralType args;
  LiteralType LVar11;
  ArrayExpr *this_00;
  Parser *in_RSI;
  tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> tVar12;
  size_type __dnew;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  fields;
  SourceLocation loc;
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  local_88;
  _Any_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Report *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  uint uStack_34;
  
  pLVar3 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  lVar4 = *(long *)&(pLVar3->location_).filename._M_dataplus;
  local_68._M_unused._M_object = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,lVar4,(pLVar3->location_).filename._M_string_length + lVar4);
  uVar1 = (pLVar3->location_).end.column;
  uVar6 = (pLVar3->location_).end.offset;
  local_48 = *(Report **)&(pLVar3->location_).begin;
  uVar8 = *(undefined8 *)&(pLVar3->location_).begin.offset;
  uStack_40 = (undefined4)uVar8;
  uStack_3c = (undefined4)((ulong)uVar8 >> 0x20);
  uStack_38 = uVar1;
  uStack_34 = uVar6;
  Lexer::nextToken((in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  local_88.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((in_RSI->lexer_)._M_t.
       super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
       super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_ == BrClose) {
LAB_00127219:
    bVar10 = expect(in_RSI,BrClose);
    if (bVar10) {
      Lexer::nextToken((in_RSI->lexer_)._M_t.
                       super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                       .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
    }
    if (local_88.
        super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_88.
        super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar3 = (in_RSI->lexer_)._M_t.
               super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
               _M_t.
               super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
               super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      pRVar5 = in_RSI->report_;
      local_a8._0_8_ = &local_98;
      local_b0 = (undefined1  [8])0x38;
      local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)local_b0);
      local_98._M_allocated_capacity = (size_type)local_b0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_a8._0_8_ + 0x20))->_M_allocated_capacity = 0x666e6920746f6e6e;
      builtin_strncpy((char *)(local_a8._0_8_ + 0x28),"er eleme",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_a8._0_8_ + 0x10))->_M_allocated_capacity = 0x6c6c6120746f6e20;
      builtin_strncpy((char *)(local_a8._0_8_ + 0x18),"owed. Ca",8);
      *(undefined8 *)local_a8._0_8_ = 0x7261207974706d45;
      builtin_strncpy((char *)(local_a8._0_8_ + 8),"rays are",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_a8._0_8_ + 0x30))->_M_allocated_capacity = 0x2e6570797420746e;
      local_a8._8_8_ = local_b0;
      *(char *)((long)&((ASTNode *)local_b0)->_vptr_ASTNode + local_a8._0_8_) = '\0';
      diagnostics::Report::typeError<>(pRVar5,&pLVar3->lastLocation_,(string *)local_a8);
LAB_00127473:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ != &local_98) {
LAB_0012747d:
        operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
      }
    }
    else {
      args = (*(*(Report **)
                 &(local_88.
                   super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t)->_vptr_Report[3])();
      puVar9 = local_88.
               super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (tVar12.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
                (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)
                (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)
                local_88.
                super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          tVar12.
          super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
          super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)puVar9;
          tVar12.
          super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
          super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)
               ((long)tVar12.
                      super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                      .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl + 8)) {
        LVar11 = (**(code **)(**(long **)tVar12.
                                         super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                                         .super__Head_base<0UL,_flow::lang::Lexer_*,_false>.
                                         _M_head_impl + 0x18))();
        if (LVar11 != args) {
          pLVar3 = (in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          pRVar5 = in_RSI->report_;
          local_a8._0_8_ = &local_98;
          local_b0 = (undefined1  [8])0x29;
          local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)local_b0);
          local_98._M_allocated_capacity = (size_type)local_b0;
          builtin_strncpy((char *)(local_a8._0_8_ + 0x19),"ray not ",8);
          builtin_strncpy((char *)(local_a8._0_8_ + 0x21),"allowed.",8);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a8._0_8_ + 0x10))->_M_allocated_capacity = 0x61206e6920736570;
          builtin_strncpy((char *)(local_a8._0_8_ + 0x18),"rray not",8);
          *(undefined8 *)local_a8._0_8_ = 0x6c6520646578694d;
          builtin_strncpy((char *)(local_a8._0_8_ + 8),"ement ty",8);
          local_a8._8_8_ = local_b0;
          *(char *)((long)&((ASTNode *)local_b0)->_vptr_ASTNode + local_a8._0_8_) = '\0';
          diagnostics::Report::typeError<>(pRVar5,&pLVar3->lastLocation_,(string *)local_a8);
          goto LAB_00127473;
        }
      }
      if ((args < RegExp) && ((0x6cU >> (args & 0x1f) & 1) != 0)) {
        pLVar3 = (in_RSI->lexer_)._M_t.
                 super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                 .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        uStack_34 = (pLVar3->lastLocation_).end.offset;
        uVar2 = (pLVar3->lastLocation_).end.line;
        uVar7 = (pLVar3->lastLocation_).end.column;
        uStack_3c = uVar2;
        uStack_38 = uVar7;
        this_00 = (ArrayExpr *)operator_new(0x58);
        ArrayExpr::ArrayExpr(this_00,(SourceLocation *)&local_68,&local_88);
        *(ArrayExpr **)&(this->features_)._M_t._M_impl = this_00;
        goto LAB_00127491;
      }
      pLVar3 = (in_RSI->lexer_)._M_t.
               super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
               _M_t.
               super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
               super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      pRVar5 = in_RSI->report_;
      local_b0 = (undefined1  [8])0x39;
      local_a8._0_8_ = &local_98;
      local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)local_b0);
      local_98._M_allocated_capacity = (size_type)local_b0;
      *(char *)(local_a8._0_8_ + 0x29) = ' ';
      *(char *)(local_a8._0_8_ + 0x2a) = 'i';
      *(char *)(local_a8._0_8_ + 0x2b) = 's';
      *(char *)(local_a8._0_8_ + 0x2c) = ' ';
      *(char *)(local_a8._0_8_ + 0x2d) = 'n';
      *(char *)(local_a8._0_8_ + 0x2e) = 'o';
      *(char *)(local_a8._0_8_ + 0x2f) = 't';
      *(char *)(local_a8._0_8_ + 0x30) = ' ';
      *(char *)(local_a8._0_8_ + 0x31) = 'a';
      *(char *)(local_a8._0_8_ + 0x32) = 'l';
      *(char *)(local_a8._0_8_ + 0x33) = 'l';
      *(char *)(local_a8._0_8_ + 0x34) = 'o';
      *(char *)(local_a8._0_8_ + 0x35) = 'w';
      *(char *)(local_a8._0_8_ + 0x36) = 'e';
      *(char *)(local_a8._0_8_ + 0x37) = 'd';
      *(char *)(local_a8._0_8_ + 0x38) = '.';
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_a8._0_8_ + 0x20))->_M_allocated_capacity = 0x7b20657079742074;
      *(char *)(local_a8._0_8_ + 0x28) = '}';
      *(char *)(local_a8._0_8_ + 0x29) = ' ';
      *(char *)(local_a8._0_8_ + 0x2a) = 'i';
      *(char *)(local_a8._0_8_ + 0x2b) = 's';
      *(char *)(local_a8._0_8_ + 0x2c) = ' ';
      *(char *)(local_a8._0_8_ + 0x2d) = 'n';
      *(char *)(local_a8._0_8_ + 0x2e) = 'o';
      *(char *)(local_a8._0_8_ + 0x2f) = 't';
      *(char *)(local_a8._0_8_ + 0x10) = 'p';
      *(char *)(local_a8._0_8_ + 0x11) = 'r';
      *(char *)(local_a8._0_8_ + 0x12) = 'e';
      *(char *)(local_a8._0_8_ + 0x13) = 's';
      *(char *)(local_a8._0_8_ + 0x14) = 's';
      *(char *)(local_a8._0_8_ + 0x15) = 'i';
      *(char *)(local_a8._0_8_ + 0x16) = 'o';
      *(char *)(local_a8._0_8_ + 0x17) = 'n';
      *(char *)(local_a8._0_8_ + 0x18) = '.';
      *(char *)(local_a8._0_8_ + 0x19) = ' ';
      *(char *)(local_a8._0_8_ + 0x1a) = 'E';
      *(char *)(local_a8._0_8_ + 0x1b) = 'l';
      *(char *)(local_a8._0_8_ + 0x1c) = 'e';
      *(char *)(local_a8._0_8_ + 0x1d) = 'm';
      *(char *)(local_a8._0_8_ + 0x1e) = 'e';
      *(char *)(local_a8._0_8_ + 0x1f) = 'n';
      *(undefined8 *)local_a8._0_8_ = 0x2064696c61766e49;
      *(char *)(local_a8._0_8_ + 8) = 'a';
      *(char *)(local_a8._0_8_ + 9) = 'r';
      *(char *)(local_a8._0_8_ + 10) = 'r';
      *(char *)(local_a8._0_8_ + 0xb) = 'a';
      *(char *)(local_a8._0_8_ + 0xc) = 'y';
      *(char *)(local_a8._0_8_ + 0xd) = ' ';
      *(char *)(local_a8._0_8_ + 0xe) = 'e';
      *(char *)(local_a8._0_8_ + 0xf) = 'x';
      local_a8._8_8_ = local_b0;
      *(char *)(local_a8._0_8_ + (long)local_b0) = '\0';
      diagnostics::Report::typeError<flow::LiteralType>
                (pRVar5,&pLVar3->lastLocation_,(string *)local_a8,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ != &local_98) goto LAB_0012747d;
    }
  }
  else {
    logicExpr((Parser *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
      ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
                ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                  *)&local_88,
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_a8);
      while (pLVar3 = (in_RSI->lexer_)._M_t.
                      super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                      .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl,
            pLVar3->token_ == Comma) {
        Lexer::nextToken(pLVar3);
        logicExpr((Parser *)local_b0);
        uVar8 = local_a8._0_8_;
        local_a8._0_8_ = local_b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)uVar8)->_M_allocated_capacity + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_0012748a;
        std::
        vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
        ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
                  ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                    *)&local_88,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_a8)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._0_8_)->_M_allocated_capacity + 8))();
      }
      goto LAB_00127219;
    }
  }
LAB_0012748a:
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
LAB_00127491:
  std::
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_unused._0_8_ != &local_58) {
    operator_delete(local_68._M_unused._M_object,local_58._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::arrayExpr() {
  SourceLocation loc = location();
  nextToken();  // '['
  std::vector<std::unique_ptr<Expr>> fields;

  if (token() != Token::BrClose) {
    auto e = expr();
    if (!e) return nullptr;

    fields.push_back(std::move(e));

    while (consumeIf(Token::Comma)) {
      e = expr();
      if (!e) return nullptr;

      fields.push_back(std::move(e));
    }
  }

  consume(Token::BrClose);

  if (!fields.empty()) {
    LiteralType baseType = fields.front()->getType();
    for (const auto& e : fields) {
      if (e->getType() != baseType) {
        report_.typeError(lastLocation(),
                          "Mixed element types in array not allowed.");
        return nullptr;
      }
    }

    switch (baseType) {
      case LiteralType::Number:
      case LiteralType::String:
      case LiteralType::IPAddress:
      case LiteralType::Cidr:
        break;
      default:
        report_.typeError(
            lastLocation(),
            "Invalid array expression. Element type {} is not allowed.",
            baseType);
        return nullptr;
    }
  } else {
    report_.typeError(
        lastLocation(),
        "Empty arrays are not allowed. Cannot infer element type.");
    return nullptr;
  }

  return std::make_unique<ArrayExpr>(loc.update(end()), std::move(fields));
}